

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O3

void duckdb::ZSTDStorage::CleanupState(ColumnSegment *segment)

{
  _func_int **pp_Var1;
  BlockManager *pBVar2;
  _Head_base<0UL,_duckdb::CompressedSegmentState_*,_false> _Var3;
  BlockHandle *pBVar4;
  long *block_id;
  _func_int **pp_Var5;
  _Head_base<0UL,_duckdb::CompressedSegmentState_*,_false> local_20;
  
  local_20._M_head_impl =
       (segment->segment_state).
       super_unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::CompressedSegmentState_*,_std::default_delete<duckdb::CompressedSegmentState>_>
       .super__Head_base<0UL,_duckdb::CompressedSegmentState_*,_false>._M_head_impl;
  optional_ptr<duckdb::CompressedSegmentState,_true>::CheckValid
            ((optional_ptr<duckdb::CompressedSegmentState,_true> *)&local_20);
  _Var3._M_head_impl = local_20._M_head_impl;
  pBVar4 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&segment->block);
  pp_Var5 = _Var3._M_head_impl[0xb]._vptr_CompressedSegmentState;
  pp_Var1 = _Var3._M_head_impl[0xc]._vptr_CompressedSegmentState;
  if (pp_Var5 != pp_Var1) {
    pBVar2 = pBVar4->block_manager;
    do {
      (*pBVar2->_vptr_BlockManager[9])(pBVar2,*pp_Var5);
      pp_Var5 = pp_Var5 + 1;
    } while (pp_Var5 != pp_Var1);
  }
  return;
}

Assistant:

void ZSTDStorage::CleanupState(ColumnSegment &segment) {
	auto &state = segment.GetSegmentState()->Cast<UncompressedStringSegmentState>();
	auto &block_manager = segment.GetBlockManager();
	for (auto &block_id : state.on_disk_blocks) {
		block_manager.MarkBlockAsModified(block_id);
	}
}